

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Atom::getGrad(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Atom *this)

{
  pointer pdVar1;
  allocator_type local_29;
  Vector3d force;
  
  force.super_Vector<double,_3U>.data_[0] = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,3,(value_type_conflict2 *)&force,&local_29);
  StuntDouble::getFrc(&force,&this->super_StuntDouble);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar1 = -force.super_Vector<double,_3U>.data_[0];
  pdVar1[1] = -force.super_Vector<double,_3U>.data_[1];
  pdVar1[2] = -force.super_Vector<double,_3U>.data_[2];
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> Atom::getGrad() {
    std::vector<RealType> grad(3, 0.0);

    Vector3d force = getFrc();

    grad[0] = -force[0];
    grad[1] = -force[1];
    grad[2] = -force[2];

    return grad;
  }